

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O2

DictionaryValue * __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::mutable_dictionary(Value_ImmediateValue *this)

{
  DictionaryValue *this_00;
  
  if (this->_oneof_case_[0] == 4) {
    this_00 = (DictionaryValue *)(this->value_).tensor_;
  }
  else {
    clear_value(this);
    this->_oneof_case_[0] = 4;
    this_00 = (DictionaryValue *)operator_new(0x30);
    DictionaryValue::DictionaryValue(this_00);
    (this->value_).dictionary_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::MILSpec::DictionaryValue* Value_ImmediateValue::mutable_dictionary() {
  if (!has_dictionary()) {
    clear_value();
    set_has_dictionary();
    value_.dictionary_ = new ::CoreML::Specification::MILSpec::DictionaryValue;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.MILSpec.Value.ImmediateValue.dictionary)
  return value_.dictionary_;
}